

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_from_parent_path_str_n
              (ext_key *hdkey,char *str,size_t str_len,uint32_t child_num,uint32_t flags,
              ext_key *key_out)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 in_register_00000084;
  undefined8 uVar3;
  byte bVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t path [255];
  
  uVar3 = CONCAT44(in_register_00000084,flags);
  if (-1 < (int)child_num && (str_len != 0 && str != (char *)0x0)) {
    if ((flags & 0x10) == 0) {
      bVar4 = *str + 0xb3;
      uVar9 = (ulong)((bVar4 & 0xdf) == 0);
      if ((uVar9 < str_len) && (str[uVar9] == '/')) {
        uVar9 = (ulong)((bVar4 & 0xdf) == 0) + 1;
      }
    }
    else {
      uVar9 = 0;
      if (*str == '/') {
        return -2;
      }
    }
    if (uVar9 < str_len) {
      uVar2 = 0;
      do {
        cVar5 = str[uVar9];
        uVar8 = uVar9;
        if ((byte)(cVar5 - 0x30U) < 10) {
          uVar6 = 0;
          do {
            uVar6 = (ulong)(byte)(cVar5 - 0x30) + uVar6 * 10;
            if (0x7fffffff < uVar6) goto LAB_0054157f;
            cVar5 = str[uVar8 + 1];
            uVar8 = uVar8 + 1;
          } while ((uVar8 < str_len) && ((byte)(cVar5 - 0x30U) < 10));
        }
        uVar6 = uVar8;
        if (uVar8 != uVar9) {
LAB_00541455:
          cVar5 = str[uVar6];
          bVar4 = 1;
          if (((cVar5 != '\'') && (cVar5 != 'H')) && (cVar5 != 'h')) {
            bVar4 = 0;
          }
          if ((uVar6 + bVar4 == str_len || uVar8 != uVar9) || (lVar7 = 2, str[uVar6 + bVar4] == '/')
             ) {
            uVar2 = 1;
            lVar7 = 0;
          }
          goto LAB_00541582;
        }
        if (cVar5 != '/') {
          if ((((byte)((flags & 8) >> 3) & cVar5 == '*') == 1) &&
             ((uVar8 == 0 || (flags = 0, str[uVar8 - 1] == '/')))) {
            flags = 0;
            uVar6 = uVar8 + 1;
            goto LAB_00541455;
          }
LAB_0054157f:
          lVar7 = 2;
LAB_00541582:
          iVar1 = (*(code *)((long)&DAT_00761610 + (long)(int)(&DAT_00761610)[lVar7]))
                            (hdkey,str,
                             (code *)((long)&DAT_00761610 + (long)(int)(&DAT_00761610)[lVar7]),uVar2
                             ,uVar3,flags);
          return iVar1;
        }
        if (((((uVar8 != 0) && (bVar4 = str[uVar8 - 1], (byte)(bVar4 - 0x3a) < 0xf6)) &&
             ((0x3e < bVar4 - 0x2a ||
              ((0x4000000040000001U >> ((ulong)(bVar4 - 0x2a) & 0x3f) & 1) == 0)))) &&
            (bVar4 != 0x27)) || (uVar9 = uVar8 + 1, uVar9 == str_len)) goto LAB_0054157f;
        switch(str[uVar9] == '/') {
        case true:
          return -2;
        }
      } while (uVar9 < str_len);
    }
  }
  return -2;
}

Assistant:

int bip32_key_from_parent_path_str_n(const struct ext_key *hdkey,
                                     const char *str, size_t str_len,
                                     uint32_t child_num, uint32_t flags,
                                     struct ext_key *key_out)
{
    uint32_t path[BIP32_PATH_MAX_LEN], *path_p = path;
    size_t written;
    int ret = path_from_string_n(str, str_len, child_num, flags,
                                 path_p, BIP32_PATH_MAX_LEN, &written);

    if (ret == WALLY_OK)
        ret = bip32_key_from_parent_path(hdkey, path, written, flags, key_out);

    return ret;
}